

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CompilationUnitSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::CompilationUnitSymbol,slang::ast::Compilation&,slang::SourceLibrary_const&>
          (BumpAllocator *this,Compilation *args,SourceLibrary *args_1)

{
  CompilationUnitSymbol *pCVar1;
  size_t in_RDX;
  size_t in_RSI;
  BumpAllocator *in_RDI;
  
  pCVar1 = (CompilationUnitSymbol *)allocate(in_RDI,in_RSI,in_RDX);
  ast::CompilationUnitSymbol::CompilationUnitSymbol((CompilationUnitSymbol *)this,args,args_1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }